

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PieceOfCinematography.h
# Opt level: O2

void __thiscall
PieceOfCinematography::edit(PieceOfCinematography *this,int optionNumber,bool *endOfEditing)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  ostream *poVar4;
  CustomException *pCVar5;
  double dVar6;
  string inputValue;
  string newGenre;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genres;
  string local_d0 [32];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&inputValue,"",(allocator *)&newGenre);
  switch(optionNumber) {
  case 1:
    poVar4 = std::operator<<((ostream *)&std::cout,"set new rating:");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::operator>>((istream *)&std::cin,(string *)&inputValue);
    dVar6 = atof(inputValue._M_dataplus._M_p);
    if ((10.0 < dVar6) || (dVar6 < 0.0)) {
      pCVar5 = (CustomException *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string((string *)&local_50,"wrong rating",(allocator *)&newGenre);
      CustomException::CustomException(pCVar5,&local_50);
      __cxa_throw(pCVar5,&CustomException::typeinfo,CustomException::~CustomException);
    }
    this->rating = dVar6;
    break;
  case 2:
    poVar4 = std::operator<<((ostream *)&std::cout,"set new number of votes:");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::operator>>((istream *)&std::cin,(string *)&inputValue);
    iVar2 = atoi(inputValue._M_dataplus._M_p);
    if (iVar2 < 0) {
      pCVar5 = (CustomException *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&local_70,"Number of votes can not be lower than 0",
                 (allocator *)&newGenre);
      CustomException::CustomException(pCVar5,&local_70);
      __cxa_throw(pCVar5,&CustomException::typeinfo,CustomException::~CustomException);
    }
    this->numberOfVotes = iVar2;
    break;
  case 3:
    std::__cxx11::string::string((string *)&newGenre,"",(allocator *)&genres);
    poVar4 = std::operator<<((ostream *)&std::cout,"set new title:");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::operator>>((istream *)&std::cin,(string *)&newGenre);
    std::__cxx11::string::string(local_d0,(string *)&newGenre);
    std::__cxx11::string::_M_assign((string *)&this->title);
    std::__cxx11::string::~string(local_d0);
    goto LAB_00103f1a;
  case 4:
    poVar4 = std::operator<<((ostream *)&std::cout,"set new year of production:");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::operator>>((istream *)&std::cin,(string *)&inputValue);
    iVar2 = atoi(inputValue._M_dataplus._M_p);
    if (iVar2 < 0) {
      pCVar5 = (CustomException *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&local_90,"Year of production can not be lower than 0",
                 (allocator *)&newGenre);
      CustomException::CustomException(pCVar5,&local_90);
      __cxa_throw(pCVar5,&CustomException::typeinfo,CustomException::~CustomException);
    }
    this->yearProduced = iVar2;
    break;
  case 5:
    poVar4 = std::operator<<((ostream *)&std::cout,"set new duration:");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::operator>>((istream *)&std::cin,(string *)&inputValue);
    iVar2 = atoi(inputValue._M_dataplus._M_p);
    if (iVar2 < 0) {
      pCVar5 = (CustomException *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&local_b0,"Duration can not be lower than 0",(allocator *)&newGenre);
      CustomException::CustomException(pCVar5,&local_b0);
      __cxa_throw(pCVar5,&CustomException::typeinfo,CustomException::~CustomException);
    }
    this->duration = iVar2;
    break;
  case 6:
    newGenre._M_dataplus._M_p = (pointer)&newGenre.field_2;
    newGenre._M_string_length = 0;
    newGenre.field_2._M_local_buf[0] = '\0';
    genres.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    genres.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    genres.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    poVar4 = std::operator<<((ostream *)&std::cout,"set the genres of the piece of cinematography:")
    ;
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"To set each genre type it and then press enter."
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "To finish setting the genres type \"apply\" and press enter.");
    std::endl<char,std::char_traits<char>>(poVar4);
    while ((piVar3 = std::operator>>((istream *)&std::cin,(string *)&newGenre),
           ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0 &&
           (bVar1 = std::operator==(&newGenre,"apply"), !bVar1))) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&genres,&newGenre);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->genres,&genres);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&genres);
LAB_00103f1a:
    std::__cxx11::string::~string((string *)&newGenre);
    break;
  case 7:
    *endOfEditing = true;
    break;
  default:
    if (optionNumber <= this->numberOfOptions) break;
  case 0:
    poVar4 = std::operator<<((ostream *)&std::cout,"wrong number");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::~string((string *)&inputValue);
  return;
}

Assistant:

virtual void edit(int optionNumber, bool &endOfEditing) {
        try {
            string inputValue="";
            if (optionNumber == 1) {
                double newRating = 0;
                cout << "set new rating:" << endl;
                cin >> inputValue;
                newRating = atof(inputValue.c_str());
                if(newRating>10 || newRating<0) throw CustomException("wrong rating");
                setRating(newRating);
            } else if (optionNumber == 2) {
                int newNumberOfVotes = 0;
                cout << "set new number of votes:" << endl;
                cin >> inputValue;
                newNumberOfVotes = atoi(inputValue.c_str());
                if(newNumberOfVotes<0) throw CustomException("Number of votes can not be lower than 0");
                setNumberOfVotes(newNumberOfVotes);
            } else if (optionNumber == 3) {
                string newTitle = "";
                cout << "set new title:" << endl;
                cin >> newTitle;
                setTitle(newTitle);
            } else if (optionNumber == 4) {
                int newYearOfProduction = 0;
                cout << "set new year of production:" << endl;
                cin >> inputValue;
                newYearOfProduction=atoi(inputValue.c_str());
                if(newYearOfProduction<0) throw CustomException("Year of production can not be lower than 0");
                setYearProduced(newYearOfProduction);
            } else if (optionNumber == 5) {
                int newDuration = 0;
                cout << "set new duration:" << endl;
                cin >> inputValue;
                newDuration=atoi(inputValue.c_str());
                if(newDuration<0) throw CustomException("Duration can not be lower than 0");
                setDuration(newDuration);
            } else if (optionNumber == 6) {
                string newGenre;
                vector<string> genres;
                cout << "set the genres of the piece of cinematography:" << endl;
                cout << "To set each genre type it and then press enter." << endl;
                cout << "To finish setting the genres type \"apply\" and press enter." << endl;
                while (cin >> newGenre) {
                    if (newGenre == "apply") break;
                    genres.push_back(newGenre);
                }
                setGenres(genres);
            } else if (optionNumber == 7) {
                endOfEditing = true;
            } else {
                if (optionNumber == 0 || optionNumber > numberOfOptions) {
                    cout << "wrong number" << endl;
                }
            }
        } catch(CustomException &e){
            cout<<e.getMessage()<<endl;
        }
    }